

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

bool Js::ReportModuleCompletion(SourceTextModuleRecord *module,Var exception)

{
  bool bVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  undefined1 uVar3;
  char16 *pcVar5;
  void *__frameAddr;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  int iVar4;
  
  scriptContext = (module->scriptContext).ptr;
  pcVar5 = SourceTextModuleRecord::GetSpecifierSz(module);
  Output::TraceWithFlush(ModulePhase,L"ReportModuleCompletion %s\n",pcVar5);
  if (scriptContext->threadContext->isScriptActive == true) {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_58,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar2 = scriptContext->threadContext;
    bVar1 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x16])
                      (scriptContext->hostScriptContext,module,exception);
    uVar3 = (undefined1)iVar4;
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar2->reentrancySafeOrHandled = bVar1;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_58);
  }
  else {
    local_58._0_4_ = ExceptionCheck::Save();
    iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x16])
                      (scriptContext->hostScriptContext,module,exception);
    uVar3 = (undefined1)iVar4;
    ExceptionCheck::Restore((Data *)local_58);
  }
  return (bool)uVar3;
}

Assistant:

static bool ReportModuleCompletion(SourceTextModuleRecord* module, Var exception)
    {
        bool hasCallback = false;
        ScriptContext* scriptContext = module->GetScriptContext();
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ReportModuleCompletion %s\n"), module->GetSpecifierSz());
        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
        {
            hasCallback = scriptContext->GetHostScriptContext()->ReportModuleCompletion(module, exception);
        });
        return hasCallback;
    }